

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O1

int QuiescentSearch(Situation *situation,int alpha,int beta)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  Movement *all_movements;
  int move_num;
  Movement move;
  Movement move_list [64];
  int local_34c;
  Movement local_348;
  Movement local_338 [64];
  
  iVar6 = step + -10000;
  iVar4 = beta;
  if ((iVar6 < beta) && (iVar2 = Evaluate(situation,alpha,beta), iVar2 <= beta)) {
    iVar4 = alpha;
    if (alpha < iVar2) {
      iVar4 = iVar2;
    }
    local_34c = 0;
    all_movements = local_338;
    CaptureMoveSort(situation,&local_34c,all_movements);
    if (0 < local_34c) {
      lVar5 = 0;
      do {
        local_348.from = all_movements->from;
        local_348.to = all_movements->to;
        local_348.capture = all_movements->capture;
        local_348._3_1_ = all_movements->field_0x3;
        local_348.value = all_movements->value;
        local_348.catc = all_movements->catc;
        local_348.movec = all_movements->movec;
        local_348._10_2_ = *(undefined2 *)&all_movements->field_0xa;
        if (local_348.value == 0) {
          return iVar4;
        }
        bVar1 = MakeAMove(situation,&local_348,false);
        if (bVar1) {
          iVar2 = step + -10000;
        }
        else {
          iVar2 = QuiescentSearch(situation,-beta,-iVar4);
          iVar2 = -iVar2;
        }
        UnMakeAMove(situation);
        if (beta <= iVar2) {
          return beta;
        }
        iVar3 = iVar4;
        if (iVar4 < iVar2) {
          iVar3 = iVar2;
        }
        if (iVar6 < iVar2) {
          iVar6 = iVar2;
          iVar4 = iVar3;
        }
        lVar5 = lVar5 + 1;
        all_movements = all_movements + 1;
      } while (lVar5 < local_34c);
    }
  }
  return iVar4;
}

Assistant:

int QuiescentSearch(Situation& situation, int alpha, int beta){
    int value;                  // 下一着法的分值
    int best;                   // 所有着法中的最佳分值
    Movement move;              // 当前着法
    Movement move_list[64];     // 当前所有着法

    best = step - MAX_VALUE;
    // 必输局面直接返回
    if(best >= beta){
        return beta;
    }
    
    // 调用评估函数进行评估
    value = Evaluate(situation, alpha, beta);
    if(value > beta)
        return beta;
    if(value > alpha)
        alpha = value;
    
    int move_num = 0;       // 着法数量
    // 生成所有吃子着法
    CaptureMoveSort(situation, move_num, move_list);
    for(int i = 0; i < move_num; i++){
        move = move_list[i];
        if(move.value == 0) break;
        // 下子
        if(MakeAMove(situation, move)){
            value = -MAX_VALUE + step;
        }
        else{
            value = -QuiescentSearch(situation, -beta, -alpha);
        }
        // 回溯
        UnMakeAMove(situation);
        if(value >= beta){
            return beta;
        }
        if(value > best){
            best = value;
            if(value > alpha){
                alpha = value;
            }
        }
    }
    return alpha;
}